

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O0

void __thiscall
CorUnix::CThreadSuspensionInfo::AcquireSuspensionLock
          (CThreadSuspensionInfo *this,CPalThread *pthrCurrent)

{
  uint uVar1;
  int iPthreadError;
  CPalThread *pthrCurrent_local;
  CThreadSuspensionInfo *this_local;
  
  uVar1 = pthread_mutex_lock((pthread_mutex_t *)&(pthrCurrent->suspensionInfo).m_ptmSuspmutex);
  if (uVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","AcquireSuspensionLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
            ,0x189);
    fprintf(_stderr,"Expression: iPthreadError == 0, Description: pthread_mutex_lock returned %d\n",
            (ulong)uVar1);
  }
  return;
}

Assistant:

void
CThreadSuspensionInfo::AcquireSuspensionLock(
    CPalThread* pthrCurrent
    )
{
#ifdef USE_GLOBAL_LOCK_FOR_SUSPENSION
{
    g_ssSuspensionLock.Enter();
}
#else // USE_GLOBAL_LOCK_FOR_SUSPENSION
{
    #if DEADLOCK_WHEN_THREAD_IS_SUSPENDED_WHILE_BLOCKED_ON_MUTEX
    {
        pthrCurrent->suspensionInfo.m_nSpinlock.Enter();
    }
    #else // DEADLOCK_WHEN_THREAD_IS_SUSPENDED_WHILE_BLOCKED_ON_MUTEX
    {
        INDEBUG(int iPthreadError = )
        pthread_mutex_lock(&pthrCurrent->suspensionInfo.m_ptmSuspmutex);
        _ASSERT_MSG(iPthreadError == 0, "pthread_mutex_lock returned %d\n", iPthreadError);
    }
    #endif // DEADLOCK_WHEN_THREAD_IS_SUSPENDED_WHILE_BLOCKED_ON_MUTEX
}
#endif // USE_GLOBAL_LOCK_FOR_SUSPENSION
}